

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::DeconvolutionDepthWise::load_param(DeconvolutionDepthWise *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->num_output = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar1;
  iVar1 = ParamDict::get(pd,0xb,iVar1);
  this->kernel_h = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar1;
  iVar1 = ParamDict::get(pd,0xc,iVar1);
  this->dilation_h = iVar1;
  iVar1 = ParamDict::get(pd,3,1);
  this->stride_w = iVar1;
  iVar1 = ParamDict::get(pd,0xd,iVar1);
  this->stride_h = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->pad_w = iVar1;
  iVar1 = ParamDict::get(pd,0xe,iVar1);
  this->pad_h = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->bias_term = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar1;
  iVar1 = ParamDict::get(pd,7,1);
  this->group = iVar1;
  return 0;
}

Assistant:

int DeconvolutionDepthWise::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_w = pd.get(4, 0);
    pad_h = pd.get(14, pad_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    group = pd.get(7, 1);

    return 0;
}